

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.cpp
# Opt level: O0

void __thiscall CodeWriter::loadWord(CodeWriter *this,string *Ri,int K,string *Rj)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_48;
  string *local_28;
  string *Rj_local;
  string *psStack_18;
  int K_local;
  string *Ri_local;
  CodeWriter *this_local;
  
  local_28 = Rj;
  Rj_local._4_4_ = K;
  psStack_18 = Ri;
  Ri_local = &this->moonOutput;
  std::__cxx11::string::operator+=((string *)this,(string *)&this->tab);
  std::__cxx11::string::operator+=((string *)this,(string *)&this->loadOp);
  std::__cxx11::string::operator+=((string *)this,(string *)&this->tab);
  std::__cxx11::string::operator+=((string *)this,(string *)psStack_18);
  std::__cxx11::string::operator+=((string *)this,(string *)&this->comma);
  std::__cxx11::to_string(&local_48,Rj_local._4_4_);
  std::__cxx11::string::operator+=((string *)this,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator+(&local_98,"(",local_28);
  std::operator+(&local_78,&local_98,")");
  std::__cxx11::string::operator+=((string *)this,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::operator+=((string *)this,(string *)&this->newLine);
  return;
}

Assistant:

void CodeWriter::loadWord(const std::string &Ri, int K, const std::string &Rj) {
    moonOutput += tab;
    moonOutput += loadOp;
    moonOutput += tab;
    moonOutput += Ri;
    moonOutput += comma;
    moonOutput += std::to_string(K);
    moonOutput += "(" + Rj + ")";
    moonOutput += newLine;
}